

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
DisasmReplayer::enqueue_create_pipeline_layout
          (DisasmReplayer *this,Hash hash,VkPipelineLayoutCreateInfo *create_info,
          VkPipelineLayout *layout)

{
  VkResult VVar1;
  VkPipelineLayoutCreateInfo *create_info_local;
  
  create_info_local = create_info;
  if (this->device == (VulkanDevice *)0x0) {
    *layout = (VkPipelineLayout)hash;
  }
  else {
    fprintf(_stderr,"Fossilize INFO: Creating pipeline layout 0%lX\n");
    fflush(_stderr);
    VVar1 = (*vkCreatePipelineLayout)
                      (this->device->device,create_info,(VkAllocationCallbacks *)0x0,layout);
    if (VVar1 != VK_SUCCESS) {
      fwrite("Fossilize ERROR:  ... Failed!\n",0x1e,1,_stderr);
      fflush(_stderr);
      return false;
    }
    fwrite("Fossilize INFO:  ... Succeeded!\n",0x20,1,_stderr);
    fflush(_stderr);
  }
  std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>::push_back
            (&this->pipeline_layouts,layout);
  std::
  vector<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>::
  push_back(&this->pipeline_layout_infos,&create_info_local);
  return true;
}

Assistant:

bool enqueue_create_pipeline_layout(Hash hash, const VkPipelineLayoutCreateInfo *create_info, VkPipelineLayout *layout) override
	{
		if (device)
		{
			LOGI("Creating pipeline layout 0%" PRIX64 "\n", hash);
			if (vkCreatePipelineLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*layout = fake_handle<VkPipelineLayout>(hash);

		pipeline_layouts.push_back(*layout);
		pipeline_layout_infos.push_back(create_info);
		return true;
	}